

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

int http_get_status(char *buf)

{
  char *in_RDI;
  bool bVar1;
  char *p;
  char *local_18;
  int local_4;
  
  local_18 = in_RDI;
  while( true ) {
    bVar1 = false;
    if (*local_18 != ' ') {
      bVar1 = *local_18 != '\0';
    }
    if (!bVar1) break;
    local_18 = local_18 + 1;
  }
  if (*local_18 == ' ') {
    for (; *local_18 == ' '; local_18 = local_18 + 1) {
    }
    local_4 = atoi(local_18);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int http_get_status(const char *buf)
{
    const char *p = buf;
    while (*p != ' ' && *p != '\0')
        p++;
    if (*p != ' ')
        return 0;
    while (*p == ' ')
        p++;
    return atoi(p);
}